

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_string.cpp
# Opt level: O1

istream * sc_dt::operator>>(istream *is,sc_string_old *s)

{
  int iVar1;
  sc_string_rep *psVar2;
  char *pcVar3;
  long *plVar4;
  long lVar5;
  char c;
  char local_29;
  
  iVar1 = s->rep->ref_count;
  if (1 < iVar1) {
    s->rep->ref_count = iVar1 + -1;
    psVar2 = (sc_string_rep *)operator_new(0x10);
    psVar2->ref_count = 1;
    psVar2->alloc = 0x10;
    pcVar3 = (char *)operator_new__(0x10);
    psVar2->str = pcVar3;
    *pcVar3 = '\0';
    s->rep = psVar2;
  }
  pcVar3 = s->rep->str;
  do {
    plVar4 = (long *)std::istream::get((char *)is);
    if ((*(byte *)((long)plVar4 + *(long *)(*plVar4 + -0x18) + 0x20) & 5) != 0) break;
    iVar1 = isspace((int)local_29);
  } while (iVar1 != 0);
  if (*(int *)(is + *(long *)(*(long *)is + -0x18) + 0x20) == 0) {
    lVar5 = 0;
    do {
      iVar1 = isspace((int)local_29);
      if (iVar1 != 0) break;
      if ((long)s->rep->alloc + -2 < lVar5) {
        s->rep->str[lVar5] = '\0';
        sc_string_rep::resize(s->rep,(int)((double)s->rep->alloc * 1.5));
        pcVar3 = s->rep->str + lVar5;
      }
      *pcVar3 = local_29;
      pcVar3 = pcVar3 + 1;
      lVar5 = lVar5 + 1;
      std::istream::get((char *)is);
    } while (*(int *)(is + *(long *)(*(long *)is + -0x18) + 0x20) == 0);
  }
  *pcVar3 = '\0';
  return is;
}

Assistant:

::std::istream&
operator >> ( ::std::istream& is, sc_string_old& s )
{
    if( s.rep->ref_count > 1 ) {
        -- s.rep->ref_count;
        s.rep = new sc_string_rep;
    }

    int i = 0;
    char* p = s.rep->str;
    char c;

    // skip white spaces
    while( is.get( c ) && isspace( c ) )
        ;

    for( ; is.good() && ! isspace( c ); is.get( c ) ) {
        if( i > s.rep->alloc - 2 ) {
	    s.rep->str[i] = '\0';
            s.rep->resize( (int) (s.rep->alloc * 1.5) );
            p = s.rep->str + i;
        }
        *p ++ = c;
        i ++;
    }
    *p = '\0';

    return is;
}